

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_application_filter.cpp
# Opt level: O2

bool __thiscall
Fossilize::ApplicationInfoFilter::Impl::test_application_info(Impl *this,VkApplicationInfo *info)

{
  EnvInfo *pEVar1;
  bool bVar2;
  size_type sVar3;
  iterator iVar4;
  char *pcVar5;
  ulong uVar6;
  char *pcVar7;
  EnvInfo *pEVar8;
  allocator local_51;
  key_type local_50;
  
  if (info == (VkApplicationInfo *)0x0) {
    return true;
  }
  if (info->pApplicationName != (char *)0x0) {
    std::__cxx11::string::string((string *)&local_50,info->pApplicationName,&local_51);
    sVar3 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::count((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)this,&local_50);
    std::__cxx11::string::_M_dispose();
    if (sVar3 != 0) {
      pcVar5 = info->pApplicationName;
      pcVar7 = "Fossilize INFO: pApplicationName %s is blacklisted for recording. Skipping.\n";
      goto LAB_0016e1c7;
    }
  }
  if (info->pEngineName != (char *)0x0) {
    std::__cxx11::string::string((string *)&local_50,info->pEngineName,&local_51);
    sVar3 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::count(&(this->blacklisted_engine_names)._M_h,&local_50);
    std::__cxx11::string::_M_dispose();
    if (sVar3 != 0) {
      pcVar5 = info->pEngineName;
      pcVar7 = "Fossilize INFO: pEngineName %s is blacklisted for recording. Skipping.\n";
      goto LAB_0016e1c7;
    }
  }
  if (info->pApplicationName != (char *)0x0) {
    std::__cxx11::string::string((string *)&local_50,info->pApplicationName,&local_51);
    iVar4 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->application_infos)._M_h,&local_50);
    std::__cxx11::string::_M_dispose();
    if (iVar4.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
        ._M_cur != (__node_type *)0x0) {
      uVar6 = (ulong)info->applicationVersion;
      if (info->applicationVersion <
          *(uint *)((long)iVar4.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
                          ._M_cur + 0x2c)) {
        pcVar5 = info->pApplicationName;
        pcVar7 = 
        "Fossilize INFO: applicationVersion %u is too low for pApplicationName %s. Skipping.\n";
        goto LAB_0016e1a8;
      }
      uVar6 = (ulong)info->apiVersion;
      if (info->apiVersion <
          *(uint *)((long)iVar4.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
                          ._M_cur + 0x28)) {
        pcVar5 = info->pApplicationName;
        pcVar7 = "Fossilize INFO: apiVersion %u is too low for pApplicationName %s. Skipping.\n";
        goto LAB_0016e1a8;
      }
      pEVar1 = *(EnvInfo **)
                ((long)iVar4.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
                       ._M_cur + 0x40);
      for (pEVar8 = *(EnvInfo **)
                     ((long)iVar4.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
                            ._M_cur + 0x38); pEVar8 != pEVar1; pEVar8 = pEVar8 + 1) {
        bVar2 = filter_env_info(this,pEVar8);
        if (bVar2) {
          pcVar5 = (pEVar8->env)._M_dataplus._M_p;
          goto LAB_0016e1c0;
        }
      }
    }
  }
  if (info->pEngineName == (char *)0x0) {
    return true;
  }
  std::__cxx11::string::string((string *)&local_50,info->pEngineName,&local_51);
  iVar4 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->engine_infos)._M_h,&local_50);
  std::__cxx11::string::_M_dispose();
  if (iVar4.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
      ._M_cur == (__node_type *)0x0) {
    return true;
  }
  uVar6 = (ulong)info->engineVersion;
  if (info->engineVersion <
      *(uint *)((long)iVar4.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
                      ._M_cur + 0x30)) {
    pcVar5 = info->pEngineName;
    pcVar7 = "Fossilize INFO: engineVersion %u is too low for pEngineName %s. Skipping.\n";
  }
  else {
    uVar6 = (ulong)info->apiVersion;
    if (*(uint *)((long)iVar4.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
                        ._M_cur + 0x28) <= info->apiVersion) {
      pEVar8 = *(EnvInfo **)
                ((long)iVar4.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
                       ._M_cur + 0x38);
      pEVar1 = *(EnvInfo **)
                ((long)iVar4.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
                       ._M_cur + 0x40);
      while( true ) {
        if (pEVar8 == pEVar1) {
          return true;
        }
        bVar2 = filter_env_info(this,pEVar8);
        if (bVar2) break;
        pEVar8 = pEVar8 + 1;
      }
      pcVar5 = (pEVar8->env)._M_dataplus._M_p;
LAB_0016e1c0:
      pcVar7 = "Fossilize INFO: Skipping recording due to environment rule for: %s.\n";
LAB_0016e1c7:
      fprintf(_stderr,pcVar7,pcVar5);
      return false;
    }
    pcVar5 = info->pEngineName;
    pcVar7 = "Fossilize INFO: apiVersion %u is too low for pEngineName %s. Skipping.\n";
  }
LAB_0016e1a8:
  fprintf(_stderr,pcVar7,uVar6,pcVar5);
  return false;
}

Assistant:

bool ApplicationInfoFilter::Impl::test_application_info(const VkApplicationInfo *info)
{
	// No app info, just assume true.
	if (!info)
		return true;

	// First, check for blacklists.
	if (info->pApplicationName && blacklisted_application_names.count(info->pApplicationName))
	{
		LOGI("pApplicationName %s is blacklisted for recording. Skipping.\n", info->pApplicationName);
		return false;
	}

	if (info->pEngineName && blacklisted_engine_names.count(info->pEngineName))
	{
		LOGI("pEngineName %s is blacklisted for recording. Skipping.\n", info->pEngineName);
		return false;
	}

	// Check versioning for applicationName.
	if (info->pApplicationName)
	{
		auto itr = application_infos.find(info->pApplicationName);
		if (itr != application_infos.end())
		{
			if (info->applicationVersion < itr->second.minimum_application_version)
			{
				LOGI("applicationVersion %u is too low for pApplicationName %s. Skipping.\n",
				     info->applicationVersion, info->pApplicationName);
				return false;
			}

			if (info->apiVersion < itr->second.minimum_api_version)
			{
				LOGI("apiVersion %u is too low for pApplicationName %s. Skipping.\n",
				     info->apiVersion, info->pApplicationName);
				return false;
			}

			for (auto &env_info : itr->second.env_infos)
			{
				if (filter_env_info(env_info))
				{
					LOGI("Skipping recording due to environment rule for: %s.\n", env_info.env.c_str());
					return false;
				}
			}
		}
	}

	// Check versioning for engineName.
	if (info->pEngineName)
	{
		auto itr = engine_infos.find(info->pEngineName);
		if (itr != engine_infos.end())
		{
			if (info->engineVersion < itr->second.minimum_engine_version)
			{
				LOGI("engineVersion %u is too low for pEngineName %s. Skipping.\n",
				     info->engineVersion, info->pEngineName);
				return false;
			}

			if (info->apiVersion < itr->second.minimum_api_version)
			{
				LOGI("apiVersion %u is too low for pEngineName %s. Skipping.\n",
				     info->apiVersion, info->pEngineName);
				return false;
			}

			for (auto &env_info : itr->second.env_infos)
			{
				if (filter_env_info(env_info))
				{
					LOGI("Skipping recording due to environment rule for: %s.\n", env_info.env.c_str());
					return false;
				}
			}
		}
	}

	// We didn't fail any filter, so we should record.
	return true;
}